

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O0

void __thiscall
slang::parsing::Preprocessor::handleProtectEncoding
          (Preprocessor *this,Token keyword,PragmaExpressionSyntax *args,
          SmallVectorBase<slang::parsing::Token> *param_3)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> _Var1;
  bool bVar2;
  ParenPragmaExpressionSyntax *pPVar3;
  SyntaxNode *pSVar4;
  Diagnostic *pDVar5;
  PragmaExpressionSyntax *pPVar6;
  uint *puVar7;
  SourceRange SVar8;
  string_view sVar9;
  basic_string_view<char,_std::char_traits<char>_> bVar10;
  _Optional_payload_base<unsigned_int> local_238;
  optional<unsigned_int> num_1;
  _Optional_payload_base<unsigned_int> local_210;
  optional<unsigned_int> num;
  allocator<char> local_129;
  string_view local_128;
  undefined1 local_118 [8];
  string valueText;
  Token value;
  undefined1 local_c8 [8];
  string_view name;
  NameValuePragmaExpressionSyntax *nvp;
  PragmaExpressionSyntax *arg;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *__range2;
  SourceRange local_48;
  SmallVectorBase<slang::parsing::Token> *param_3_local;
  PragmaExpressionSyntax *args_local;
  Preprocessor *this_local;
  Token keyword_local;
  
  keyword_local._0_8_ = keyword.info;
  this_local = keyword._0_8_;
  if ((args != (PragmaExpressionSyntax *)0x0) &&
     ((args->super_SyntaxNode).kind == ParenPragmaExpression)) {
    pPVar3 = slang::syntax::SyntaxNode::as<slang::syntax::ParenPragmaExpressionSyntax>
                       (&args->super_SyntaxNode);
    bVar2 = slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::empty
                      (&pPVar3->values);
    if (!bVar2) {
      this->protectLineLength = 0;
      this->protectBytes = 0;
      pPVar3 = slang::syntax::SyntaxNode::as<slang::syntax::ParenPragmaExpressionSyntax>
                         (&args->super_SyntaxNode);
      join_0x00000010_0x00000000_ =
           slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::begin
                     (&pPVar3->values);
      _arg = slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::end
                       (&pPVar3->values);
      while (bVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::PragmaExpressionSyntax_*,_unsigned_long,_const_slang::syntax::PragmaExpressionSyntax_**,_const_slang::syntax::PragmaExpressionSyntax_*&>
                     ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::PragmaExpressionSyntax_*,_unsigned_long,_const_slang::syntax::PragmaExpressionSyntax_**,_const_slang::syntax::PragmaExpressionSyntax_*&>
                                   *)&__end2.index,
                                  (iterator_base<const_slang::syntax::PragmaExpressionSyntax_*> *)
                                  &arg), bVar2) {
        pSVar4 = &slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::
                  iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>::operator*
                            ((iterator_base<const_slang::syntax::PragmaExpressionSyntax_*> *)
                             &__end2.index)->super_SyntaxNode;
        if (pSVar4->kind == NameValuePragmaExpression) {
          name._M_str = (char *)slang::syntax::SyntaxNode::
                                as<slang::syntax::NameValuePragmaExpressionSyntax>(pSVar4);
          sVar9 = Token::valueText(&((NameValuePragmaExpressionSyntax *)name._M_str)->name);
          _local_c8 = sVar9;
          bVar10 = sv("enctype",7);
          bVar2 = std::operator==(sVar9,bVar10);
          bVar10 = _local_c8;
          if (bVar2) {
            pSVar4 = &not_null<slang::syntax::PragmaExpressionSyntax_*>::operator->
                                ((not_null<slang::syntax::PragmaExpressionSyntax_*> *)
                                 (name._M_str + 0x30))->super_SyntaxNode;
            join_0x00000010_0x00000000_ = slang::syntax::SyntaxNode::getFirstToken(pSVar4);
            local_128 = Token::valueText((Token *)((long)&valueText.field_2 + 8));
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                      ((string *)local_118,&local_128,&local_129);
            std::allocator<char>::~allocator(&local_129);
            strToLower((string *)local_118);
            _Var1 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_118);
            bVar10 = sv("uuencode",8);
            bVar2 = std::operator==(_Var1,bVar10);
            if (bVar2) {
              this->protectEncoding = UUEncode;
            }
            else {
              _Var1 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                      std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_118);
              bVar10 = sv("base64",6);
              bVar2 = std::operator==(_Var1,bVar10);
              if (bVar2) {
                this->protectEncoding = Base64;
              }
              else {
                _Var1 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                        std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((string *)local_118);
                bVar10 = sv("quoted-printable",0x10);
                bVar2 = std::operator==(_Var1,bVar10);
                if (bVar2) {
                  this->protectEncoding = QuotedPrintable;
                }
                else {
                  _Var1 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                          std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((string *)local_118);
                  bVar10 = sv("raw",3);
                  bVar2 = std::operator==(_Var1,bVar10);
                  if (bVar2) {
                    this->protectEncoding = Raw;
                  }
                  else {
                    this->protectEncoding = Raw;
                    SVar8 = Token::range((Token *)((long)&valueText.field_2 + 8));
                    pDVar5 = addDiag(this,(DiagCode)0x2c0004,SVar8);
                    sVar9 = Token::valueText((Token *)((long)&valueText.field_2 + 8));
                    Diagnostic::operator<<(pDVar5,sVar9);
                  }
                }
              }
            }
            std::__cxx11::string::~string((string *)local_118);
          }
          else {
            _num = sv("line_length",0xb);
            bVar2 = std::operator==(bVar10,_num);
            bVar10 = _local_c8;
            if (bVar2) {
              pPVar6 = not_null<slang::syntax::PragmaExpressionSyntax_*>::operator*
                                 ((not_null<slang::syntax::PragmaExpressionSyntax_*> *)
                                  (name._M_str + 0x30));
              local_210 = (_Optional_payload_base<unsigned_int>)requireUInt32(this,pPVar6);
              bVar2 = std::optional::operator_cast_to_bool((optional *)&local_210);
              if (bVar2) {
                puVar7 = std::optional<unsigned_int>::operator*
                                   ((optional<unsigned_int> *)&local_210);
                this->protectLineLength = *puVar7;
              }
            }
            else {
              _num_1 = sv("bytes",5);
              bVar2 = std::operator==(bVar10,_num_1);
              if (bVar2) {
                pPVar6 = not_null<slang::syntax::PragmaExpressionSyntax_*>::operator*
                                   ((not_null<slang::syntax::PragmaExpressionSyntax_*> *)
                                    (name._M_str + 0x30));
                local_238 = (_Optional_payload_base<unsigned_int>)requireUInt32(this,pPVar6);
                bVar2 = std::optional::operator_cast_to_bool((optional *)&local_238);
                if (bVar2) {
                  puVar7 = std::optional<unsigned_int>::operator*
                                     ((optional<unsigned_int> *)&local_238);
                  this->protectBytes = *puVar7;
                }
              }
              else {
                bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                                  ((basic_string_view<char,_std::char_traits<char>_> *)local_c8);
                if (!bVar2) {
                  SVar8 = Token::range((Token *)(name._M_str + 0x10));
                  pDVar5 = addDiag(this,(DiagCode)0x2e0004,SVar8);
                  sVar9 = Token::valueText((Token *)&this_local);
                  pDVar5 = Diagnostic::operator<<(pDVar5,sVar9);
                  Diagnostic::operator<<(pDVar5,_local_c8);
                }
              }
            }
          }
        }
        else {
          SVar8 = slang::syntax::SyntaxNode::sourceRange(pSVar4);
          pDVar5 = addDiag(this,(DiagCode)0x270004,SVar8);
          sVar9 = Token::valueText((Token *)&this_local);
          Diagnostic::operator<<(pDVar5,sVar9);
        }
        iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::PragmaExpressionSyntax_*,_unsigned_long,_const_slang::syntax::PragmaExpressionSyntax_**,_const_slang::syntax::PragmaExpressionSyntax_*&>
        ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_std::random_access_iterator_tag,_const_slang::syntax::PragmaExpressionSyntax_*,_unsigned_long,_const_slang::syntax::PragmaExpressionSyntax_**,_const_slang::syntax::PragmaExpressionSyntax_*&>
                      *)&__end2.index);
      }
      return;
    }
  }
  if (args == (PragmaExpressionSyntax *)0x0) {
    local_48 = Token::range((Token *)&this_local);
  }
  else {
    local_48 = slang::syntax::SyntaxNode::sourceRange(&args->super_SyntaxNode);
  }
  pDVar5 = addDiag(this,(DiagCode)0x270004,local_48);
  sVar9 = Token::valueText((Token *)&this_local);
  Diagnostic::operator<<(pDVar5,sVar9);
  return;
}

Assistant:

void Preprocessor::handleProtectEncoding(Token keyword, const PragmaExpressionSyntax* args,
                                         SmallVectorBase<Token>&) {
    if (!args || args->kind != SyntaxKind::ParenPragmaExpression ||
        args->as<ParenPragmaExpressionSyntax>().values.empty()) {
        addDiag(diag::ProtectArgList, args ? args->sourceRange() : keyword.range())
            << keyword.valueText();
        return;
    }

    protectLineLength = 0;
    protectBytes = 0;

    for (auto arg : args->as<ParenPragmaExpressionSyntax>().values) {
        if (arg->kind != SyntaxKind::NameValuePragmaExpression) {
            addDiag(diag::ProtectArgList, arg->sourceRange()) << keyword.valueText();
            continue;
        }

        auto& nvp = arg->as<NameValuePragmaExpressionSyntax>();
        auto name = nvp.name.valueText();
        if (name == "enctype"sv) {
            auto value = nvp.value->getFirstToken();

            std::string valueText(value.valueText());
            strToLower(valueText);

            if (valueText == "uuencode"sv) {
                protectEncoding = ProtectEncoding::UUEncode;
            }
            else if (valueText == "base64"sv) {
                protectEncoding = ProtectEncoding::Base64;
            }
            else if (valueText == "quoted-printable"sv) {
                protectEncoding = ProtectEncoding::QuotedPrintable;
            }
            else if (valueText == "raw"sv) {
                protectEncoding = ProtectEncoding::Raw;
            }
            else {
                protectEncoding = ProtectEncoding::Raw;
                addDiag(diag::UnknownProtectEncoding, value.range()) << value.valueText();
            }
        }
        else if (name == "line_length"sv) {
            if (auto num = requireUInt32(*nvp.value))
                protectLineLength = *num;
        }
        else if (name == "bytes"sv) {
            if (auto num = requireUInt32(*nvp.value))
                protectBytes = *num;
        }
        else if (!name.empty()) {
            addDiag(diag::UnknownProtectOption, nvp.name.range()) << keyword.valueText() << name;
        }
    }
}